

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * QLocale::scriptToString(QString *__return_storage_ptr__,Script script)

{
  DataPointer *pDVar1;
  storage_type *in_RCX;
  undefined6 in_register_00000032;
  QString *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)CONCAT62(in_register_00000032,script) < 0x8f) {
    ba_00.m_size = "Default" + script_name_index[script];
    this = (QString *)0xffffffffffffffff;
    do {
      pDVar1 = &this->d;
      this = (QString *)((long)&(this->d).d + 1);
    } while ("Default"[(long)&pDVar1->d + (ulong)script_name_index[script] + 1] != '\0');
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      ba_00.m_data = (storage_type *)script_name_index;
      QString::fromUtf8(__return_storage_ptr__,this,ba_00);
      return __return_storage_ptr__;
    }
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"Unknown";
    QString::fromLatin1(&local_38,(QString *)&DAT_00000007,ba);
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    (__return_storage_ptr__->d).size = local_38.d.size;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::scriptToString(Script script)
{
    if (script > LastScript)
        return "Unknown"_L1;
    return QString::fromUtf8(script_name_list + script_name_index[script]);
}